

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O3

M44f * anon_unknown.dwarf_8c458::createRandomMat
                 (M44f *__return_storage_ptr__,Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  undefined7 extraout_var;
  int j;
  long lVar14;
  float (*pafVar15) [4];
  int k;
  long lVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  V3f s;
  V3f sh;
  V3f r;
  V3f t;
  undefined8 local_a8;
  float local_a0;
  V3f *local_98;
  V3f *local_90;
  V3f local_84;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Vec3<float> local_54;
  Vec3<float> local_48;
  V3f local_3c;
  
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[1] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[0][0] = 1.0;
  __return_storage_ptr__->x[1][1] = 1.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  local_98 = rot;
  local_90 = trans;
  getRandTRS(random,&local_3c,&local_48,&local_84);
  Imath_2_5::Matrix44<float>::translate<float>(__return_storage_ptr__,&local_3c);
  Imath_2_5::Matrix44<float>::rotate<float>(__return_storage_ptr__,&local_48);
  dVar1 = Imath_2_5::erand48(random->_state);
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_8_ = dVar1;
  local_68._12_4_ = extraout_XMM0_Dd;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_78._8_4_ = extraout_XMM0_Dc_00;
  local_78._0_8_ = dVar1;
  local_78._12_4_ = extraout_XMM0_Dd_00;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_a0 = (float)((1.0 - dVar1) * 1e-06 + dVar1 + dVar1);
  local_a8 = CONCAT44((float)((1.0 - (double)local_78._0_8_) * 1e-06 +
                             (double)local_78._0_8_ + (double)local_78._0_8_),
                      (float)((1.0 - (double)local_68._0_8_) * 1e-06 +
                             (double)local_68._0_8_ + (double)local_68._0_8_));
  lVar14 = 0;
  do {
    dVar1 = Imath_2_5::erand48(random->_state);
    if (0.5 <= (1.0 - dVar1) * 0.0 + dVar1) {
      *(uint *)((long)&local_a8 + lVar14 * 4) = *(uint *)((long)&local_a8 + lVar14 * 4) ^ 0x80000000
      ;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  fVar2 = __return_storage_ptr__->x[0][0];
  fVar3 = __return_storage_ptr__->x[0][1];
  fVar4 = __return_storage_ptr__->x[0][2];
  fVar5 = __return_storage_ptr__->x[0][3];
  fVar6 = __return_storage_ptr__->x[1][0];
  fVar7 = __return_storage_ptr__->x[1][1];
  fVar8 = __return_storage_ptr__->x[1][2];
  fVar9 = __return_storage_ptr__->x[1][3];
  fVar10 = __return_storage_ptr__->x[2][1];
  fVar11 = __return_storage_ptr__->x[2][2];
  fVar12 = __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[2][0] =
       local_a8._4_4_ * fVar2 + local_a0 * fVar6 + __return_storage_ptr__->x[2][0];
  __return_storage_ptr__->x[2][1] = local_a8._4_4_ * fVar3 + local_a0 * fVar7 + fVar10;
  __return_storage_ptr__->x[2][2] = local_a8._4_4_ * fVar4 + local_a0 * fVar8 + fVar11;
  __return_storage_ptr__->x[2][3] = local_a8._4_4_ * fVar5 + local_a0 * fVar9 + fVar12;
  __return_storage_ptr__->x[1][0] = (float)local_a8 * fVar2 + fVar6;
  __return_storage_ptr__->x[1][1] = (float)local_a8 * fVar3 + fVar7;
  __return_storage_ptr__->x[1][2] = (float)local_a8 * fVar4 + fVar8;
  __return_storage_ptr__->x[1][3] = (float)local_a8 * fVar5 + fVar9;
  Imath_2_5::Matrix44<float>::scale<float>(__return_storage_ptr__,&local_84);
  lVar14 = 0;
  pafVar15 = (float (*) [4])__return_storage_ptr__;
  do {
    lVar16 = 0;
    do {
      dVar1 = Imath_2_5::erand48(random->_state);
      (*(float (*) [4])*pafVar15)[lVar16] =
           (float)((double)(*(float (*) [4])*pafVar15)[lVar16] +
                  (1.0 - dVar1) * -1e-07 + dVar1 * 1e-07);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar14 = lVar14 + 1;
    pafVar15 = pafVar15 + 1;
  } while (lVar14 != 4);
  bVar13 = Imath_2_5::extractSHRT<float>
                     (__return_storage_ptr__,scale,&local_54,local_98,local_90,true,Default);
  return (M44f *)CONCAT71(extraout_var,bVar13);
}

Assistant:

M44f
createRandomMat(Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    
    M44f M;
    V3f t, r, s;
    getRandTRS(random, t, r, s);
    
    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0), 
           random.nextf (0.000001, 2.0));

    for (int j=0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5)
            h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += random.nextf (-1e-7, 1e-7);

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));
    
    return M;
}